

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<kj::_::Void,_kj::_::PromiseAndFulfillerAdapter<void>_>::fulfill
          (AdapterPromiseNode<kj::_::Void,_kj::_::PromiseAndFulfillerAdapter<void>_> *this,
          Void *value)

{
  Void *value_00;
  ExceptionOr<kj::_::Void> local_180;
  Void *local_18;
  Void *value_local;
  AdapterPromiseNode<kj::_::Void,_kj::_::PromiseAndFulfillerAdapter<void>_> *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = value;
    value_local = (Void *)this;
    value_00 = mv<kj::_::Void>(value);
    ExceptionOr<kj::_::Void>::ExceptionOr(&local_180,value_00);
    ExceptionOr<kj::_::Void>::operator=(&this->result,&local_180);
    ExceptionOr<kj::_::Void>::~ExceptionOr(&local_180);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }